

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

string * __thiscall
pfederc::IfExpr::toString_abi_cxx11_(string *__return_storage_ptr__,IfExpr *this)

{
  ulong uVar1;
  bool bVar2;
  const_reference pvVar3;
  __tuple_element_t<0UL,_tuple<unique_ptr<Expr,_default_delete<Expr>_>,_unique_ptr<BodyExpr,_default_delete<BodyExpr>_>_>_>
  *p_Var4;
  pointer pEVar5;
  __tuple_element_t<1UL,_tuple<unique_ptr<Expr,_default_delete<Expr>_>,_unique_ptr<BodyExpr,_default_delete<BodyExpr>_>_>_>
  *p_Var6;
  pointer pBVar7;
  size_type sVar8;
  BodyExpr *pBVar9;
  string local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  ulong local_88;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  IfExpr *local_18;
  IfExpr *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (IfExpr *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar2 = isEnsure(this);
  if (bVar2) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"ensure ");
  }
  else {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"if ");
  }
  pvVar3 = std::
           vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
           ::operator[](&this->ifCases,0);
  p_Var4 = std::
           get<0ul,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
                     (pvVar3);
  pEVar5 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->(p_Var4);
  (*pEVar5->_vptr_Expr[2])();
  std::operator+(&local_40,&local_60,'\n');
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  pvVar3 = std::
           vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
           ::operator[](&this->ifCases,0);
  p_Var6 = std::
           get<1ul,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
                     (pvVar3);
  pBVar7 = std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::operator->
                     (p_Var6);
  BodyExpr::toString_abi_cxx11_((string *)&i,pBVar7);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  for (local_88 = 1; uVar1 = local_88,
      sVar8 = std::
              vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
              ::size(&this->ifCases), uVar1 < sVar8; local_88 = local_88 + 1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"else ");
    bVar2 = isEnsure(this);
    if (bVar2) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"ensure ");
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"if ");
    }
    pvVar3 = std::
             vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
             ::operator[](&this->ifCases,local_88);
    p_Var4 = std::
             get<0ul,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
                       (pvVar3);
    pEVar5 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->(p_Var4)
    ;
    (*pEVar5->_vptr_Expr[2])();
    std::operator+(&local_a8,&local_c8,'\n');
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    pvVar3 = std::
             vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
             ::operator[](&this->ifCases,local_88);
    p_Var6 = std::
             get<1ul,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
                       (pvVar3);
    pBVar7 = std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::operator->
                       (p_Var6);
    BodyExpr::toString_abi_cxx11_(&local_e8,pBVar7);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  pBVar9 = getElse(this);
  if (pBVar9 != (BodyExpr *)0x0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"else\n");
    pBVar9 = getElse(this);
    BodyExpr::toString_abi_cxx11_(&local_108,pBVar9);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,';');
  return __return_storage_ptr__;
}

Assistant:

std::string IfExpr::toString() const noexcept {
  std::string result;

  if (isEnsure())
    result += "ensure ";
  else
    result += "if ";

  result += std::get<0>(ifCases[0])->toString() + '\n';
  result += std::get<1>(ifCases[0])->toString();

  for (size_t i = 1; i < ifCases.size(); ++i) {
    result += "else ";
    if (isEnsure())
      result += "ensure ";
    else
      result += "if ";

    result += std::get<0>(ifCases[i])->toString() + '\n';
    result += std::get<1>(ifCases[i])->toString();
  }

  if (getElse()) {
    result += "else\n";
    result += getElse()->toString();
  }

  result += ';';

  return result;
}